

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UnicodeString *stringToAdopt)

{
  UnicodeString *ctx;
  UnicodeString *stringToAdopt_local;
  Formattable *this_local;
  
  ctx = stringToAdopt;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_005ba5d0;
  icu_63::UnicodeString::UnicodeString(&this->fBogus);
  init(this,(EVP_PKEY_CTX *)ctx);
  this->fType = kString;
  (this->fValue).fString = stringToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UnicodeString* stringToAdopt)
{
    init();
    fType = kString;
    fValue.fString = stringToAdopt;
}